

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void intermediate_adder(uint *b,uint *end,IntermediateBuffer *intermediate,int offset,int *fx,
                       int fdx)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  int in_ECX;
  long in_RDX;
  uint *in_RSI;
  uint *in_RDI;
  uint *in_R8;
  int in_R9D;
  uint ag;
  uint rb;
  uint idistx;
  uint distx;
  int x;
  int in_stack_000000f4;
  int *in_stack_000000f8;
  int in_stack_00000104;
  IntermediateBuffer *in_stack_00000108;
  uint *in_stack_00000110;
  uint *in_stack_00000118;
  uint *local_8;
  
  uVar3 = qCpuFeatures();
  if ((uVar3 & 0x76ff) == 0x76ff) {
    intermediate_adder_avx2
              (in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000104,
               in_stack_000000f8,in_stack_000000f4);
  }
  else {
    *in_R8 = *in_R8 + in_ECX * -0x10000;
    local_8 = in_RDI;
    while (local_8 < in_RSI) {
      iVar1 = (int)*in_R8 >> 0x10;
      iVar2 = (int)(*in_R8 & 0xffff) >> 8;
      *local_8 = (*(int *)(in_RDX + (long)iVar1 * 4) * (0x100 - iVar2) +
                  *(int *)(in_RDX + (long)(iVar1 + 1) * 4) * iVar2 & 0xff00ff00U) >> 8 |
                 *(int *)(in_RDX + 0x2008 + (long)iVar1 * 4) * (0x100 - iVar2) +
                 *(int *)(in_RDX + 0x2008 + (long)(iVar1 + 1) * 4) * iVar2 & 0xff00ff00U;
      local_8 = local_8 + 1;
      *in_R8 = in_R9D + *in_R8;
    }
    *in_R8 = in_ECX * 0x10000 + *in_R8;
  }
  return;
}

Assistant:

static void QT_FASTCALL intermediate_adder(uint *b, uint *end, const IntermediateBuffer &intermediate, int offset, int &fx, int fdx)
{
#if defined(QT_COMPILER_SUPPORTS_AVX2)
    extern void QT_FASTCALL intermediate_adder_avx2(uint *b, uint *end, const IntermediateBuffer &intermediate, int offset, int &fx, int fdx);
    if (qCpuHasFeature(ArchHaswell))
        return intermediate_adder_avx2(b, end, intermediate, offset, fx, fdx);
#endif

    // Switch to intermediate buffer coordinates
    fx -= offset * fixed_scale;

    while (b < end) {
        const int x = (fx >> 16);

        const uint distx = (fx & 0x0000ffff) >> 8;
        const uint idistx = 256 - distx;
        const uint rb = (intermediate.buffer_rb[x] * idistx + intermediate.buffer_rb[x + 1] * distx) & 0xff00ff00;
        const uint ag = (intermediate.buffer_ag[x] * idistx + intermediate.buffer_ag[x + 1] * distx) & 0xff00ff00;
        *b = (rb >> 8) | ag;
        b++;
        fx += fdx;
    }
    fx += offset * fixed_scale;
}